

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqdiff.c
# Opt level: O0

void show_usage(int status)

{
  int status_local;
  
  fprintf(_stderr,"seqdiff - a bioinformatics tool for comparing sequences in two files\n");
  fprintf(_stderr,"\n(Written by bct - 2013)     ");
  fprintf(_stderr,"\nUsage:\n%s -1 <first input fasta/fastq file> -2 <second fasta/fastq file>\n\n",
          progname);
  fprintf(_stderr,
          "  Options:\n    -1, --first,      First sequence file (required)\n    -2, --second,     Second sequence file (required)\n"
         );
  fprintf(_stderr,
          "    -a, --a_output,   File name for uniques from first file\n    -b, --b_output,   File name for uniques from second file\n    -c, --c_output,   File name for common entries\n"
         );
  fprintf(_stderr,
          "    -d, --headers,    Compare headers instead of sequences (default: false)\n    -s, --summary, Just show summary stats? (default: false)\n"
         );
  fprintf(_stderr,
          "    -h, --help,       Display this help and exit\n    -v, --verbose,    Print extra details during the run\n    --version,        Output version information and exit\n\n"
         );
  exit(status);
}

Assistant:

void show_usage(int status) {
	fprintf(stderr, "seqdiff - a bioinformatics tool for comparing sequences in two files\n");
	fprintf(stderr, "\n(Written by bct - 2013)     ");
	/*  fprintf(stderr, "search method: %s",PULLSEQ_SORTMETHOD); */
	fprintf(stderr, "\nUsage:\n"
			"%s -1 <first input fasta/fastq file> -2 <second fasta/fastq file>\n\n", progname);
	fprintf(stderr, "  Options:\n"
			"    -1, --first,      First sequence file (required)\n"
			"    -2, --second,     Second sequence file (required)\n");
	fprintf(stderr, "    -a, --a_output,   File name for uniques from first file\n"
			"    -b, --b_output,   File name for uniques from second file\n"
			"    -c, --c_output,   File name for common entries\n");

	fprintf(stderr, "    -d, --headers,    Compare headers instead of sequences (default: false)\n"
			"    -s, --summary, Just show summary stats? (default: false)\n");
	fprintf(stderr, "    -h, --help,       Display this help and exit\n"
			"    -v, --verbose,    Print extra details during the run\n"
			"    --version,        Output version information and exit\n\n");
	exit(status);
}